

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ply.cc
# Opt level: O3

void gvr::anon_unknown_3::readASCIIElement(streambuf *in,char *out,int n)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  long lVar4;
  
  if (*(byte **)(in + 0x10) < *(byte **)(in + 0x18)) {
    uVar2 = (uint)**(byte **)(in + 0x10);
  }
  else {
    uVar2 = (**(code **)(*(long *)in + 0x48))(in);
    if (uVar2 == 0xffffffff) {
      lVar4 = 0;
      goto LAB_0011ea7e;
    }
  }
  lVar4 = 0;
  do {
    iVar1 = isspace(uVar2);
    if (iVar1 == 0) {
      iVar1 = 0;
      goto LAB_0011ea51;
    }
    uVar2 = std::streambuf::snextc();
  } while (uVar2 != 0xffffffff);
  goto LAB_0011ea7e;
  while( true ) {
    if (iVar1 < 0x27) {
      lVar4 = (long)iVar1;
      iVar1 = iVar1 + 1;
      out[lVar4] = (char)uVar2;
    }
    uVar2 = std::streambuf::snextc();
    if (uVar2 == 0xffffffff) break;
LAB_0011ea51:
    iVar3 = isspace(uVar2);
    if (iVar3 != 0) break;
  }
  lVar4 = (long)iVar1;
LAB_0011ea7e:
  out[lVar4] = '\0';
  return;
}

Assistant:

void readASCIIElement(std::streambuf *in, char *out, int n)
{
  // eat white spaces

  int c=in->sgetc();

  while (c != EOF && isspace(c))
  {
    c=in->snextc();
  }

  // read until next white space or end of file

  n--;
  int i=0;

  while (c != EOF && !isspace(c))
  {
    if (i < n)
    {
      out[i++]=static_cast<char>(c);
    }

    c=in->snextc();
  }

  out[i]='\0';
}